

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QScrollerPrivate::ScrollSegment>::Inserter::Inserter
          (Inserter *this,QArrayDataPointer<QScrollerPrivate::ScrollSegment> *d,qsizetype pos,
          qsizetype n)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = *(long *)(in_RSI + 8) + in_RDX * 0x40;
  in_RDI[2] = in_RDI[1] + in_RCX * 0x40;
  in_RDI[3] = in_RCX;
  in_RDI[4] = (*(long *)(*in_RDI + 0x10) - in_RDX) * 0x40;
  memmove((void *)in_RDI[2],(void *)in_RDI[1],in_RDI[4]);
  return;
}

Assistant:

explicit Inserter(QArrayDataPointer<T> *d, qsizetype pos, qsizetype n)
            : data{d},
              displaceFrom{d->ptr + pos},
              displaceTo{displaceFrom + n},
              nInserts{n},
              bytes{(data->size - pos) * sizeof(T)}
        {
            ::memmove(static_cast<void *>(displaceTo), static_cast<void *>(displaceFrom), bytes);
        }